

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statemachine.cpp
# Opt level: O0

callback_t *
begin_property_set_state
          (callback_t *__return_storage_ptr__,MetaConfiguration *conf,ifstream *f,int *error)

{
  bool bVar1;
  QLoggingCategory *pQVar2;
  char *pcVar3;
  QDebug *pQVar4;
  element_type *peVar5;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_130;
  QMessageLogger local_f0;
  QDebug local_d0 [15];
  bool local_c1;
  undefined1 local_c0 [7];
  bool qt_category_enabled_1;
  QDebug local_a0 [11];
  bool local_95;
  bool qt_category_enabled;
  undefined1 local_88 [8];
  string tmp;
  string value;
  string name;
  int *error_local;
  ifstream *f_local;
  MetaConfiguration *conf_local;
  
  std::__cxx11::string::string((string *)(value.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)(tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_88);
  std::istream::ignore();
  while( true ) {
    std::operator>>((istream *)f,(string *)(value.field_2._M_local_buf + 8));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&value.field_2 + 8),"}");
    if (bVar1) break;
    std::operator>>((istream *)f,(string *)local_88);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_88,"}");
    if (bVar1) break;
    std::operator>>((istream *)f,(string *)(tmp.field_2._M_local_buf + 8));
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&tmp.field_2 + 8),"}");
    if (bVar1) break;
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            ((long)&value.field_2 + 8),"value");
    if (bVar1) {
      pQVar2 = parser();
      local_95 = QLoggingCategory::isDebugEnabled(pQVar2);
      while (local_95 != false) {
        pQVar2 = parser();
        pcVar3 = QLoggingCategory::categoryName(pQVar2);
        QMessageLogger::QMessageLogger((QMessageLogger *)local_c0,(char *)0x0,0,(char *)0x0,pcVar3);
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<(local_a0,"found value for property  ");
        operator<<(pQVar4,(string *)((long)&tmp.field_2 + 8));
        QDebug::~QDebug(local_a0);
        local_95 = false;
      }
      peVar5 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(anonymous_namespace)::current_property);
      std::__cxx11::string::operator=
                ((string *)&peVar5->default_value,(string *)(tmp.field_2._M_local_buf + 8));
    }
    else {
      pQVar2 = parser();
      local_c1 = QLoggingCategory::isDebugEnabled(pQVar2);
      while (local_c1 != false) {
        pQVar2 = parser();
        pcVar3 = QLoggingCategory::categoryName(pQVar2);
        QMessageLogger::QMessageLogger(&local_f0,(char *)0x0,0,(char *)0x0,pcVar3);
        QMessageLogger::debug();
        pQVar4 = QDebug::operator<<(local_d0,"found setter ");
        pQVar4 = operator<<(pQVar4,(string *)((long)&value.field_2 + 8));
        pQVar4 = QDebug::operator<<(pQVar4," with value ");
        operator<<(pQVar4,(string *)((long)&tmp.field_2 + 8));
        QDebug::~QDebug(local_d0);
        local_c1 = false;
      }
      peVar5 = std::__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<MetaProperty,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)(anonymous_namespace)::current_property);
      std::make_pair<std::__cxx11::string&,std::__cxx11::string&>
                (&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&value.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&tmp.field_2 + 8));
      std::
      map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
      ::insert<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((map<std::__cxx11::string,std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                  *)&peVar5->setters,&local_130);
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~pair(&local_130);
    }
  }
  std::
  function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
  ::
  function<std::function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>(&)(MetaConfiguration&,std::ifstream&,int&),void>
            ((function<RecursiveHelper<MetaConfiguration&,std::ifstream&,int&>(MetaConfiguration&,std::ifstream&,int&)>
              *)__return_storage_ptr__,end_property_state);
  std::__cxx11::string::~string((string *)local_88);
  std::__cxx11::string::~string((string *)(tmp.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(value.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

callback_t begin_property_set_state(MetaConfiguration &conf, std::ifstream &f,
                                    int &error) {
  std::string name;
  std::string value;
  std::string tmp;
  f.ignore(); // ignoring {

  do {
    f >> name;
    if (name == "}")
      break;

    f >> tmp;
    if (tmp == "}")
      break;

    f >> value;
    if (value == "}")
      break;

    if (name == "value") {
      qCDebug(parser) << "found value for property  " << value;
      current_property->default_value = value;
    } else {
      qCDebug(parser) << "found setter " << name << " with value " << value;
      current_property->setters.insert(std::make_pair(name, value));
    }
  } while (true);
  return end_property_state;
}